

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

Var __thiscall
Js::JavascriptNativeFloatArray::DirectGetItem(JavascriptNativeFloatArray *this,uint32 index)

{
  Type TVar1;
  DynamicObjectFlags DVar2;
  int iVar3;
  Var pvVar4;
  Type *pTVar5;
  Type *pTVar6;
  Type local_28;
  Var element;
  
  DVar2 = DynamicObject::GetArrayFlags((DynamicObject *)this);
  pTVar5 = (Type *)((long)(this->super_JavascriptNativeArray).super_JavascriptArray.segmentUnion +
                   0x20);
  if ((DVar2 & HasSegmentMap) == None) {
    pTVar5 = &(this->super_JavascriptNativeArray).super_JavascriptArray.segmentUnion;
  }
  TVar1 = *pTVar5;
  if ((*(uint *)TVar1 <= index) && (index - *(uint *)TVar1 < *(uint *)((long)TVar1 + 4))) {
    if (*(undefined1 **)((uint *)((long)TVar1 + 0x18) + (ulong)(index - *(uint *)TVar1) * 2) !=
        &DAT_fff80002fff80002) {
      pvVar4 = JavascriptNumber::ToVarWithCheck
                         ((double)*(undefined1 **)
                                   ((uint *)((long)TVar1 + 0x18) +
                                   (ulong)(index - *(uint *)TVar1) * 2),
                          (((((this->super_JavascriptNativeArray).super_JavascriptArray.
                              super_ArrayObject.super_DynamicObject.super_RecyclableObject.type.ptr)
                            ->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
                          ptr);
      return pvVar4;
    }
  }
  pTVar6 = &local_28;
  local_28.ptr = (RecyclableObject *)0x0;
  iVar3 = (**(code **)((long)(this->super_JavascriptNativeArray).super_JavascriptArray.
                             super_ArrayObject.super_DynamicObject.super_RecyclableObject.
                             super_FinalizableObject.super_IRecyclerVisitedObject + 0x388))
                    (this,index,pTVar6);
  if (iVar3 == 0) {
    pTVar6 = &(((((this->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.
                  super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
              super_JavascriptLibraryBase).undefinedValue;
  }
  return pTVar6->ptr;
}

Assistant:

Var JavascriptNativeFloatArray::DirectGetItem(uint32 index)
    {
        SparseArraySegment<double> *seg = (SparseArraySegment<double>*)this->GetLastUsedSegment();
        uint32 offset = index - seg->left;
        if (index >= seg->left && offset < seg->length)
        {
            if (!SparseArraySegment<double>::IsMissingItem(&seg->elements[offset]))
            {
                return JavascriptNumber::ToVarWithCheck(seg->elements[offset], GetScriptContext());
            }
        }
        Var element = nullptr;
        if (DirectGetItemAtFull(index, &element))
        {
            return element;
        }
        return GetType()->GetLibrary()->GetUndefined();
    }